

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxStatus sendx(genxWriter w,constUtf8 s)

{
  int iVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  genxStatus local_4;
  
  if (in_RDI[1] == 0) {
    iVar1 = fputs(in_RSI,(FILE *)*in_RDI);
    if (iVar1 == -1) {
      local_4 = GENX_IO_ERROR;
    }
    else {
      local_4 = GENX_SUCCESS;
    }
  }
  else {
    local_4 = (**(code **)in_RDI[1])(in_RDI[0x2003],in_RSI);
  }
  return local_4;
}

Assistant:

static genxStatus sendx(genxWriter w, constUtf8 s)
{
  if (w->sender)
    return (*w->sender->send)(w->userData, s);
  else
  {
    if (fputs((const char *) s, w->file) == -1)
      return GENX_IO_ERROR;
    else
      return GENX_SUCCESS;
  }
}